

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  int iVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindow *window_00;
  ImDrawList *this;
  long lVar5;
  
  pIVar3 = *(GImGui->Viewports).Data;
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  this = window->DrawList;
  if (1 < (this->_Splitter)._Count) {
    ImDrawList::ChannelsMerge(this);
    this = window->DrawList;
  }
  ImGui::AddDrawListToDrawDataEx
            (&pIVar3->DrawDataP,(pIVar3->DrawDataBuilder).Layers[(uint)layer],this);
  ppIVar4 = (window->DC).ChildWindows.Data;
  iVar2 = (window->DC).ChildWindows.Size;
  for (lVar5 = 0; (long)iVar2 * 8 != lVar5; lVar5 = lVar5 + 8) {
    window_00 = *(ImGuiWindow **)((long)ppIVar4 + lVar5);
    if ((window_00->Active == true) && (window_00->Hidden == false)) {
      AddWindowToDrawData(window_00,layer);
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    g.IO.MetricsRenderWindows++;
    if (window->DrawList->_Splitter._Count > 1)
        window->DrawList->ChannelsMerge(); // Merge if user forgot to merge back. Also required in Docking branch for ImGuiWindowFlags_DockNodeHost windows.
    ImGui::AddDrawListToDrawDataEx(&viewport->DrawDataP, viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (ImGuiWindow* child : window->DC.ChildWindows)
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
}